

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpheaders.cpp
# Opt level: O2

void __thiscall
QHttpHeadersPrivate::values(QHttpHeadersPrivate *this,HeaderName *name,QList<QByteArray> *result)

{
  bool bVar1;
  long lVar2;
  Header *h;
  Header *__lhs;
  
  __lhs = (this->headers).d.ptr;
  for (lVar2 = (this->headers).d.size * 0x38; lVar2 != 0; lVar2 = lVar2 + -0x38) {
    bVar1 = std::operator==((variant<QHttpHeaders::WellKnownHeader,_QByteArray> *)__lhs,&name->data)
    ;
    if (bVar1) {
      QList<QByteArray>::emplaceBack<QByteArray_const&>(result,&__lhs->value);
    }
    __lhs = __lhs + 1;
  }
  return;
}

Assistant:

void QHttpHeadersPrivate::values(const HeaderName &name, QList<QByteArray> &result) const
{
    for (const auto &h : std::as_const(headers)) {
        if (h.name == name)
            result.append(h.value);
    }
}